

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

LY_ERR lys_search_localfile
                 (char **searchpaths,ly_bool cwd,char *name,char *revision,char **localfile,
                 LYS_INFORMAT *format)

{
  char *pcVar1;
  char cVar2;
  ly_set *set;
  LY_ERR LVar3;
  byte bVar4;
  LY_ERR LVar5;
  int iVar6;
  lyd_node *__name;
  DIR *__dirp;
  int *piVar7;
  char *pcVar8;
  size_t sVar9;
  dirent *pdVar10;
  char *pcVar11;
  uint uVar12;
  long lVar13;
  LYS_INFORMAT LVar14;
  undefined4 uVar15;
  char *match_name;
  LYS_INFORMAT local_11c;
  LYS_INFORMAT local_118;
  undefined4 local_114;
  ly_set *dirs;
  char *str;
  long local_100;
  long local_f8;
  size_t local_f0;
  long local_e8;
  LYS_INFORMAT *local_e0;
  ulong local_d8;
  char *local_d0;
  char **local_c8;
  stat local_c0;
  
  match_name = (char *)0x0;
  if (localfile == (char **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","localfile",
           "lys_search_localfile");
    return LY_EINVAL;
  }
  local_d0 = revision;
  local_c8 = localfile;
  LVar5 = ly_set_new(&dirs);
  if (LVar5 != LY_SUCCESS) {
    return LVar5;
  }
  local_f0 = strlen(name);
  if (cwd == '\0') {
    LVar5 = LY_EMEM;
    local_114 = 0;
    local_e0 = format;
  }
  else {
    __name = (lyd_node *)get_current_dir_name();
    if (__name == (lyd_node *)0x0) {
      LVar5 = LY_EMEM;
LAB_00157aba:
      __name = (lyd_node *)0x0;
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lys_search_localfile");
      __dirp = (DIR *)0x0;
      goto LAB_00157b49;
    }
    local_e0 = format;
    LVar5 = ly_set_add(dirs,__name,'\0',(uint32_t *)0x0);
    if (LVar5 != LY_SUCCESS) {
LAB_00157acc:
      __dirp = (DIR *)0x0;
      goto LAB_00157b49;
    }
    local_114 = 1;
    LVar5 = LY_SUCCESS;
  }
  uVar15 = local_114;
  if (searchpaths != (char **)0x0) {
    for (; pcVar8 = *searchpaths, pcVar8 != (char *)0x0; searchpaths = searchpaths + 1) {
      if (((char)uVar15 == '\0') ||
         (iVar6 = strcmp((char *)*(dirs->field_2).dnodes,pcVar8), iVar6 != 0)) {
        __name = (lyd_node *)strdup(pcVar8);
        if (__name == (lyd_node *)0x0) goto LAB_00157aba;
        LVar5 = ly_set_add(dirs,__name,'\0',(uint32_t *)0x0);
        LVar3 = LY_SUCCESS;
        if (LVar5 != LY_SUCCESS) goto LAB_00157acc;
      }
      else {
        uVar15 = 0;
        LVar3 = LVar5;
      }
      LVar5 = LVar3;
    }
  }
  local_114 = uVar15;
  local_d8 = ~local_f0;
  local_100 = 0;
  __name = (lyd_node *)0x0;
  __dirp = (DIR *)0x0;
  local_118 = LYS_IN_UNKNOWN;
  lVar13 = local_f0 + 1;
LAB_001576bd:
  if (dirs->count != 0) {
    free(__name);
    uVar12 = dirs->count - 1;
    dirs->count = uVar12;
    __name = (dirs->field_2).dnodes[uVar12];
    (dirs->field_2).dnodes[uVar12] = (lyd_node *)0x0;
    ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Searching for \"%s\" in \"%s\".",name,__name);
    if (__dirp != (DIR *)0x0) {
      closedir(__dirp);
    }
    __dirp = opendir((char *)__name);
    if (__dirp != (DIR *)0x0) {
      sVar9 = strlen((char *)__name);
      local_e8 = sVar9 + lVar13;
      local_f8 = lVar13;
LAB_00157768:
      pdVar10 = readdir(__dirp);
      set = dirs;
      lVar13 = local_f8;
      if (pdVar10 != (dirent *)0x0) {
        if ((byte)pdVar10->d_name[0] == 0x2e) goto code_r0x00157782;
        iVar6 = 0x2e - (uint)(byte)pdVar10->d_name[0];
        goto LAB_0015779e;
      }
      goto LAB_001576bd;
    }
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    ly_log((ly_ctx *)0x0,LY_LLWRN,LY_SUCCESS,
           "Unable to open directory \"%s\" for searching (sub)modules (%s).",__name,pcVar8);
    __dirp = (DIR *)0x0;
    goto LAB_001576bd;
  }
LAB_00157b24:
  *local_c8 = match_name;
  match_name = (char *)0x0;
  LVar5 = LY_SUCCESS;
  if (local_e0 != (LYS_INFORMAT *)0x0) {
    *local_e0 = local_118;
  }
LAB_00157b49:
  free(__name);
  if (__dirp != (DIR *)0x0) {
    closedir(__dirp);
  }
  free(match_name);
  ly_set_free(dirs,free);
  return LVar5;
code_r0x00157782:
  if (pdVar10->d_name[1] == '\0') goto LAB_00157768;
  uVar12 = (byte)pdVar10->d_name[1] - 0x2e;
  if (uVar12 == 0) {
    uVar12 = (uint)(byte)pdVar10->d_name[2];
  }
  iVar6 = -uVar12;
LAB_0015779e:
  if (iVar6 == 0) goto LAB_00157768;
  pcVar8 = pdVar10->d_name;
  str = (char *)0x0;
  bVar4 = pdVar10->d_type >> 1 | pdVar10->d_type << 7;
  LVar5 = LY_SUCCESS;
  if (bVar4 == 5) {
LAB_001577d3:
    iVar6 = asprintf(&str,"%s/%s",__name,pcVar8);
    if (iVar6 == -1) {
LAB_001578a6:
      LVar5 = LY_EMEM;
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lys_search_localfile_file_type");
    }
    else {
      iVar6 = stat(str,&local_c0);
      if (iVar6 == 0) {
        if ((local_c0.st_mode & 0xf000) == 0x4000) goto LAB_0015784f;
      }
      else {
        piVar7 = __errno_location();
        pcVar11 = strerror(*piVar7);
        ly_log((ly_ctx *)0x0,LY_LLWRN,LY_SUCCESS,
               "Unable to get information about \"%s\" file in \"%s\" when searching for (sub)modules (%s)"
               ,pcVar8,__name,pcVar11);
        LVar5 = LY_SUCCESS;
      }
    }
  }
  else if (bVar4 == 2) {
LAB_0015784f:
    if (((char)local_114 == '\0') || (LVar5 = LY_SUCCESS, set->count != 0)) {
      if ((str == (char *)0x0) && (iVar6 = asprintf(&str,"%s/%s",__name), iVar6 == -1))
      goto LAB_001578a6;
      LVar5 = ly_set_add(set,str,'\0',(uint32_t *)0x0);
      if (LVar5 == LY_SUCCESS) {
        str = (char *)0x0;
        LVar5 = LY_SUCCESS;
      }
    }
  }
  else if (bVar4 == 0) goto LAB_001577d3;
  free(str);
  if (LVar5 != LY_SUCCESS) goto LAB_00157b49;
  iVar6 = strncmp(name,pcVar8,local_f0);
  if ((iVar6 != 0) || ((cVar2 = pcVar8[local_f0], cVar2 != '@' && (cVar2 != '.'))))
  goto LAB_00157768;
  sVar9 = strlen(pcVar8);
  if (sVar9 < 6) {
    if (sVar9 != 5) goto LAB_00157768;
LAB_00157944:
    iVar6 = strcmp(pcVar8 + (sVar9 - 4),".yin");
    lVar13 = -4;
    LVar14 = LYS_IN_YIN;
    if (iVar6 != 0) goto LAB_00157768;
  }
  else {
    iVar6 = strcmp(pcVar8 + (sVar9 - 5),".yang");
    lVar13 = -5;
    LVar14 = LYS_IN_YANG;
    if (iVar6 != 0) goto LAB_00157944;
  }
  pcVar11 = local_d0;
  if (local_d0 == (char *)0x0) {
    if (match_name != (char *)0x0) {
      if (cVar2 != '@') goto LAB_00157768;
      pcVar11 = pcVar8 + local_f8;
      local_11c = LVar14;
      LVar5 = lysp_check_date((lysp_ctx *)0x0,pcVar11,sVar9 + local_d8 + lVar13,(char *)0x0);
      pcVar1 = match_name;
      if ((LVar5 != LY_SUCCESS) ||
         ((match_name[local_100] == '@' &&
          (iVar6 = strncmp(match_name + local_100 + 1,pcVar11,10), -1 < iVar6)))) goto LAB_00157768;
      free(pcVar1);
      LVar14 = local_11c;
    }
    iVar6 = asprintf(&match_name,"%s/%s",__name,pcVar8);
    local_118 = LVar14;
  }
  else {
    if (cVar2 == '@') {
      pcVar1 = pcVar8 + local_f8;
      local_11c = LVar14;
      sVar9 = strlen(local_d0);
      iVar6 = strncmp(pcVar11,pcVar1,sVar9);
      if (iVar6 != 0) goto LAB_00157768;
      free(match_name);
      iVar6 = asprintf(&match_name,"%s/%s",__name,pcVar8);
      if (iVar6 != -1) {
        local_118 = local_11c;
        goto LAB_00157b24;
      }
      goto LAB_00157ae0;
    }
    local_11c = LVar14;
    free(match_name);
    iVar6 = asprintf(&match_name,"%s/%s",__name,pcVar8);
    local_118 = local_11c;
  }
  local_100 = local_e8;
  if (iVar6 != -1) goto LAB_00157768;
LAB_00157ae0:
  LVar5 = LY_SUCCESS;
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_search_localfile");
  goto LAB_00157b49;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_search_localfile(const char * const *searchpaths, ly_bool cwd, const char *name, const char *revision,
        char **localfile, LYS_INFORMAT *format)
{
    LY_ERR ret = LY_EMEM;
    size_t len, flen, match_len = 0, dir_len;
    ly_bool implicit_cwd = 0, skip;
    char *wd;
    DIR *dir = NULL;
    struct dirent *file;
    char *match_name = NULL;
    LYS_INFORMAT format_aux, match_format = 0;
    struct ly_set *dirs;

    LY_CHECK_ARG_RET(NULL, localfile, LY_EINVAL);

    /* start to fill the dir fifo with the context's search path (if set)
     * and the current working directory */
    LY_CHECK_RET(ly_set_new(&dirs));

    len = strlen(name);
    if (cwd) {
        wd = get_current_dir_name();
        if (!wd) {
            LOGMEM(NULL);
            goto cleanup;
        } else {
            /* add implicit current working directory (./) to be searched,
             * this directory is not searched recursively */
            ret = ly_set_add(dirs, wd, 0, NULL);
            LY_CHECK_GOTO(ret, cleanup);
            implicit_cwd = 1;
        }
    }
    if (searchpaths) {
        for (uint64_t i = 0; searchpaths[i]; i++) {
            /* check for duplicities with the implicit current working directory */
            if (implicit_cwd && !strcmp(dirs->objs[0], searchpaths[i])) {
                implicit_cwd = 0;
                continue;
            }
            wd = strdup(searchpaths[i]);
            if (!wd) {
                LOGMEM(NULL);
                goto cleanup;
            } else {
                ret = ly_set_add(dirs, wd, 0, NULL);
                LY_CHECK_GOTO(ret, cleanup);
            }
        }
    }
    wd = NULL;

    /* start searching */
    while (dirs->count) {
        free(wd);

        dirs->count--;
        wd = (char *)dirs->objs[dirs->count];
        dirs->objs[dirs->count] = NULL;
        LOGVRB("Searching for \"%s\" in \"%s\".", name, wd);

        if (dir) {
            closedir(dir);
        }
        dir = opendir(wd);
        dir_len = strlen(wd);
        if (!dir) {
            LOGWRN(NULL, "Unable to open directory \"%s\" for searching (sub)modules (%s).", wd, strerror(errno));
            continue;
        }

        /* search the directory */
        while ((file = readdir(dir))) {
            if (!strcmp(".", file->d_name) || !strcmp("..", file->d_name)) {
                /* skip . and .. */
                continue;
            }

            /* check whether file type is */
            if ((ret = lys_search_localfile_file_type(file, wd, dirs, implicit_cwd, &skip))) {
                goto cleanup;
            }

            /* here we know that the item is a file which can contain a module */
            if (strncmp(name, file->d_name, len) || ((file->d_name[len] != '.') && (file->d_name[len] != '@'))) {
                /* different filename than the module we search for */
                continue;
            }

            /* get type according to filename suffix */
            flen = strlen(file->d_name);
            if ((flen >= LY_YANG_SUFFIX_LEN + 1) && !strcmp(&file->d_name[flen - LY_YANG_SUFFIX_LEN], LY_YANG_SUFFIX)) {
                format_aux = LYS_IN_YANG;
            } else if ((flen >= LY_YIN_SUFFIX_LEN + 1) && !strcmp(&file->d_name[flen - LY_YIN_SUFFIX_LEN], LY_YIN_SUFFIX)) {
                format_aux = LYS_IN_YIN;
            } else {
                /* not supported suffix/file format */
                continue;
            }

            if (revision) {
                /* we look for the specific revision, try to get it from the filename */
                if (file->d_name[len] == '@') {
                    /* check revision from the filename */
                    if (strncmp(revision, &file->d_name[len + 1], strlen(revision))) {
                        /* another revision */
                        continue;
                    } else {
                        /* exact revision */
                        free(match_name);
                        if (asprintf(&match_name, "%s/%s", wd, file->d_name) == -1) {
                            LOGMEM(NULL);
                            goto cleanup;
                        }
                        match_len = dir_len + 1 + len;
                        match_format = format_aux;
                        goto success;
                    }
                } else {
                    /* continue trying to find exact revision match, use this only if not found */
                    free(match_name);
                    if (asprintf(&match_name, "%s/%s", wd, file->d_name) == -1) {
                        LOGMEM(NULL);
                        goto cleanup;
                    }
                    match_len = dir_len + 1 + len;
                    match_format = format_aux;
                    continue;
                }
            } else {
                /* remember the revision and try to find the newest one */
                if (match_name) {
                    if ((file->d_name[len] != '@') ||
                            lysp_check_date(NULL, &file->d_name[len + 1],
                            flen - ((format_aux == LYS_IN_YANG) ? LY_YANG_SUFFIX_LEN : LY_YIN_SUFFIX_LEN) - len - 1, NULL)) {
                        continue;
                    } else if ((match_name[match_len] == '@') &&
                            (strncmp(&match_name[match_len + 1], &file->d_name[len + 1], LY_REV_SIZE - 1) >= 0)) {
                        continue;
                    }
                    free(match_name);
                }

                if (asprintf(&match_name, "%s/%s", wd, file->d_name) == -1) {
                    LOGMEM(NULL);
                    goto cleanup;
                }
                match_len = dir_len + 1 + len;
                match_format = format_aux;
                continue;
            }
        }
    }

success:
    (*localfile) = match_name;
    match_name = NULL;
    if (format) {
        (*format) = match_format;
    }
    ret = LY_SUCCESS;

cleanup:
    free(wd);
    if (dir) {
        closedir(dir);
    }
    free(match_name);
    ly_set_free(dirs, free);

    return ret;
}